

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall
t_html_generator::generate_program_toc_rows
          (t_html_generator *this,t_program *tprog,
          vector<t_program_*,_std::allocator<t_program_*>_> *finished)

{
  pointer pptVar1;
  __type _Var2;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  t_program **iter;
  pointer pptVar3;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  t_program *local_48;
  _Vector_base<t_program_*,_std::allocator<t_program_*>_> local_40;
  
  pptVar3 = (finished->super__Vector_base<t_program_*,_std::allocator<t_program_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pptVar1 = (finished->super__Vector_base<t_program_*,_std::allocator<t_program_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  local_48 = tprog;
  do {
    if (pptVar3 == pptVar1) {
      std::vector<t_program_*,_std::allocator<t_program_*>_>::push_back(finished,&local_48);
      generate_program_toc_row(this,local_48);
      std::vector<t_program_*,_std::allocator<t_program_*>_>::vector
                ((vector<t_program_*,_std::allocator<t_program_*>_> *)&local_40,&local_48->includes_
                );
      for (; local_40._M_impl.super__Vector_impl_data._M_start !=
             local_40._M_impl.super__Vector_impl_data._M_finish;
          local_40._M_impl.super__Vector_impl_data._M_start =
               local_40._M_impl.super__Vector_impl_data._M_start + 1) {
        generate_program_toc_rows(this,*local_40._M_impl.super__Vector_impl_data._M_start,finished);
      }
      std::_Vector_base<t_program_*,_std::allocator<t_program_*>_>::~_Vector_base(&local_40);
      return;
    }
    _Var2 = std::operator==(&tprog->path_,&(*pptVar3)->path_);
    pptVar3 = pptVar3 + 1;
  } while (!_Var2);
  return;
}

Assistant:

void t_html_generator::generate_program_toc_rows(t_program* tprog,
                                                 std::vector<t_program*>& finished) {
  for (auto & iter : finished) {
    if (tprog->get_path() == iter->get_path()) {
      return;
    }
  }
  finished.push_back(tprog);
  generate_program_toc_row(tprog);
  vector<t_program*> includes = tprog->get_includes();
  for (auto & include : includes) {
    generate_program_toc_rows(include, finished);
  }
}